

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

bool __thiscall ExpressionContext::IsIntegerType(ExpressionContext *this,TypeBase *type)

{
  undefined4 in_EAX;
  int iVar1;
  undefined1 auVar2 [16];
  
  auVar2._0_4_ = -(uint)(type == this->typeBool);
  auVar2._4_4_ = -(uint)(type == this->typeChar);
  auVar2._8_4_ = -(uint)(type == this->typeShort);
  auVar2._12_4_ = -(uint)(type == this->typeInt);
  iVar1 = movmskps(in_EAX,auVar2);
  return this->typeLong == type || iVar1 != 0;
}

Assistant:

bool ExpressionContext::IsIntegerType(TypeBase* type)
{
	if(type == typeBool)
		return true;

	if(type == typeChar)
		return true;

	if(type == typeShort)
		return true;

	if(type == typeInt)
		return true;

	if(type == typeLong)
		return true;

	return false;
}